

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments *app)

{
  MyDocument *pMVar1;
  MyDocument *doc;
  int doc_n;
  ExampleAppDocuments *app_local;
  
  for (doc._4_4_ = 0; doc._4_4_ < (app->Documents).Size; doc._4_4_ = doc._4_4_ + 1) {
    pMVar1 = ImVector<MyDocument>::operator[](&app->Documents,doc._4_4_);
    if (((pMVar1->Open & 1U) == 0) && ((pMVar1->OpenPrev & 1U) != 0)) {
      ImGui::SetTabItemClosed(pMVar1->Name);
    }
    pMVar1->OpenPrev = (bool)(pMVar1->Open & 1);
  }
  return;
}

Assistant:

static void NotifyOfDocumentsClosedElsewhere(ExampleAppDocuments& app)
{
    for (int doc_n = 0; doc_n < app.Documents.Size; doc_n++)
    {
        MyDocument* doc = &app.Documents[doc_n];
        if (!doc->Open && doc->OpenPrev)
            ImGui::SetTabItemClosed(doc->Name);
        doc->OpenPrev = doc->Open;
    }
}